

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O2

int ndiGetTXMarkerInfo(ndicapi *pol,int ph,int marker)

{
  uint uVar1;
  unsigned_long uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = pol->TxHandleCount;
  uVar4 = 0;
  uVar3 = 0;
  if (0 < (int)uVar1) {
    uVar3 = (ulong)uVar1;
  }
  do {
    if (uVar3 == uVar4) {
LAB_00108551:
      if (0x13 < (uint)marker || (uint)uVar3 == uVar1) {
        return 1;
      }
      uVar2 = ndiHexToUnsignedLong(pol->TxInformation[marker + 2],1);
      return (int)uVar2;
    }
    if ((uint)pol->TxHandles[uVar4] == ph) {
      uVar3 = uVar4 & 0xffffffff;
      goto LAB_00108551;
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

ndicapiExport int ndiGetTXMarkerInfo(ndicapi* pol, int ph, int marker)
{
  char* dp;
  int i, n;

  n = pol->TxHandleCount;
  for (i = 0; i < n; i++)
  {
    if (pol->TxHandles[i] == ph)
    {
      break;
    }
  }
  if (i == n || marker < 0 || marker >= 20)
  {
    return NDI_DISABLED;
  }

  dp = pol->TxInformation[2 + marker];
  return (int)ndiHexToUnsignedLong(dp, 1);
}